

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O3

QUuid __thiscall QUuid::fromString(QUuid *this,QAnyStringView text)

{
  long in_FS_OFFSET;
  QUuid QVar1;
  char *in_stack_00000008;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    QVar1 = _q_uuidFromHex(in_stack_00000008);
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QUuid QUuid::fromString(QAnyStringView text) noexcept
{
    return text.visit([] (auto text) { return uuidFromString(text); });
}